

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  char **ppcVar1;
  sqlite3 *db;
  ExprList_item *pEVar2;
  ExprList *pEVar3;
  uint uVar4;
  
  db = pParse->db;
  if (pList == (ExprList *)0x0) {
    pEVar3 = (ExprList *)sqlite3DbMallocRawNN(db,0x28);
    if (pEVar3 == (ExprList *)0x0) {
LAB_00145964:
      sqlite3ExprDelete(db,pExpr);
      sqlite3ExprListDelete(db,pList);
      return (ExprList *)0x0;
    }
    pEVar3->nExpr = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = pList->nExpr;
    pEVar3 = pList;
    if ((uVar4 & uVar4 - 1) == 0) {
      pEVar3 = (ExprList *)sqlite3DbRealloc(db,pList,(long)(int)uVar4 << 6 | 8);
      if (pEVar3 == (ExprList *)0x0) goto LAB_00145964;
      uVar4 = pEVar3->nExpr;
    }
  }
  pEVar3->nExpr = uVar4 + 1;
  ppcVar1 = &pEVar3->a[(int)uVar4].zName;
  *ppcVar1 = (char *)0x0;
  ppcVar1[1] = (char *)0x0;
  pEVar2 = pEVar3->a + (int)uVar4;
  pEVar2->sortOrder = '\0';
  *(undefined3 *)&pEVar2->field_0x19 = 0;
  pEVar2->u = (anon_union_4_2_6146edf4_for_u)0x0;
  pEVar3->a[(int)uVar4].pExpr = pExpr;
  return pEVar3;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  assert( db!=0 );
  if( pList==0 ){
    pList = sqlite3DbMallocRawNN(db, sizeof(ExprList) );
    if( pList==0 ){
      goto no_mem;
    }
    pList->nExpr = 0;
  }else if( (pList->nExpr & (pList->nExpr-1))==0 ){
    ExprList *pNew;
    pNew = sqlite3DbRealloc(db, pList, 
             sizeof(*pList)+(2*pList->nExpr - 1)*sizeof(pList->a[0]));
    if( pNew==0 ){
      goto no_mem;
    }
    pList = pNew;
  }
  pItem = &pList->a[pList->nExpr++];
  assert( offsetof(struct ExprList_item,zName)==sizeof(pItem->pExpr) );
  assert( offsetof(struct ExprList_item,pExpr)==0 );
  memset(&pItem->zName,0,sizeof(*pItem)-offsetof(struct ExprList_item,zName));
  pItem->pExpr = pExpr;
  return pList;

no_mem:     
  /* Avoid leaking memory if malloc has failed. */
  sqlite3ExprDelete(db, pExpr);
  sqlite3ExprListDelete(db, pList);
  return 0;
}